

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blacklist.c
# Opt level: O0

int ipv4_key_cmp(void *a,void *b)

{
  void *b_local;
  void *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a < b) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int ipv4_key_cmp(const void *a, const void *b)
{
     if (a == b)
         return 0;
     else if (a< b)
         return -1;
     else
         return 1; 
}